

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_MacProjector.cpp
# Opt level: O2

void __thiscall
Hydro::MacProjector::project
          (MacProjector *this,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *phi_inout,Real reltol,
          Real atol)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  int ilev;
  ulong uVar4;
  
  uVar1 = ((long)(this->m_rhs).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                 super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)(this->m_rhs).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
                super__Vector_impl_data._M_start) / 0x180;
  uVar2 = 0;
  uVar4 = uVar1 & 0xffffffff;
  if ((int)uVar1 < 1) {
    uVar4 = uVar2;
  }
  for (uVar1 = 0; uVar4 != uVar1; uVar1 = uVar1 + 1) {
    amrex::MultiFab::Copy
              ((MultiFab *)
               ((long)&(((this->m_phi).
                         super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                         super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                         _M_impl.super__Vector_impl_data._M_start)->super_FabArray<amrex::FArrayBox>
                       ).super_FabArrayBase + uVar2),
               (phi_inout->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
               super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar1],0,0,1,0);
    uVar2 = uVar2 + 0x180;
  }
  project(this,reltol,atol);
  lVar3 = 0;
  for (uVar1 = 0; uVar4 != uVar1; uVar1 = uVar1 + 1) {
    amrex::MultiFab::Copy
              ((phi_inout->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
               super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar1],
               (MultiFab *)
               ((long)&(((this->m_phi).
                         super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                         super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                         _M_impl.super__Vector_impl_data._M_start)->super_FabArray<amrex::FArrayBox>
                       ).super_FabArrayBase + lVar3),0,0,1,0);
    lVar3 = lVar3 + 0x180;
  }
  return;
}

Assistant:

void
MacProjector::project (const Vector<MultiFab*>& phi_inout, Real reltol, Real atol)
{
    const int nlevs = m_rhs.size();
    for (int ilev = 0; ilev < nlevs; ++ilev) {
        MultiFab::Copy(m_phi[ilev], *phi_inout[ilev], 0, 0, 1, 0);
    }

    project(reltol, atol);

    for (int ilev = 0; ilev < nlevs; ++ilev) {
        MultiFab::Copy(*phi_inout[ilev], m_phi[ilev], 0, 0, 1, 0);
    }
}